

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cStencilTexturingTests.cpp
# Opt level: O0

GLuint gl4cts::StencilTexturing::Utils::createAndFill2DTexture
                 (Context *context,GLuint width,GLuint height,GLenum internal_format,GLenum format,
                 GLenum type,GLvoid *data)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  exception *exc;
  GLuint local_34;
  long lStack_30;
  GLuint id;
  Functions *gl;
  GLenum local_20;
  GLenum type_local;
  GLenum format_local;
  GLenum internal_format_local;
  GLuint height_local;
  GLuint width_local;
  Context *context_local;
  
  gl._4_4_ = type;
  local_20 = format;
  type_local = internal_format;
  format_local = height;
  internal_format_local = width;
  _height_local = context;
  pRVar3 = deqp::Context::getRenderContext(context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_30 = CONCAT44(extraout_var,iVar1);
  local_34 = 0;
  (**(code **)(lStack_30 + 0x6f8))(1,&local_34);
  dVar2 = (**(code **)(lStack_30 + 0x800))();
  glu::checkError(dVar2,"GenTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x112);
  (**(code **)(lStack_30 + 0xb8))(0xde1,local_34);
  dVar2 = (**(code **)(lStack_30 + 0x800))();
  glu::checkError(dVar2,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x117);
  (**(code **)(lStack_30 + 0x1310))
            (0xde1,0,type_local,internal_format_local,format_local,0,local_20,gl._4_4_,data);
  dVar2 = (**(code **)(lStack_30 + 0x800))();
  glu::checkError(dVar2,"TexImage2D",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x11a);
  (**(code **)(lStack_30 + 0x1360))(0xde1,0x813c,0);
  (**(code **)(lStack_30 + 0x1360))(0xde1,0x813d,0);
  dVar2 = (**(code **)(lStack_30 + 0x800))();
  glu::checkError(dVar2,"TexParameteri",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x11e);
  (**(code **)(lStack_30 + 0xb8))(0xde1,0);
  dVar2 = (**(code **)(lStack_30 + 0x800))();
  glu::checkError(dVar2,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cStencilTexturingTests.cpp"
                  ,0x121);
  return local_34;
}

Assistant:

GLuint Utils::createAndFill2DTexture(deqp::Context& context, GLuint width, GLuint height, GLenum internal_format,
									 GLenum format, GLenum type, const GLvoid* data)
{
	const Functions& gl = context.getRenderContext().getFunctions();
	GLuint			 id = 0;

	gl.genTextures(1, &id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenTextures");

	try
	{
		gl.bindTexture(GL_TEXTURE_2D, id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.texImage2D(GL_TEXTURE_2D, 0 /* level */, internal_format, width, height, 0 /* border */, format, type, data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexImage2D");

		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_BASE_LEVEL, 0);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAX_LEVEL, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexParameteri");

		gl.bindTexture(GL_TEXTURE_2D, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");
	}
	catch (std::exception& exc)
	{
		gl.deleteTextures(1, &id);
		id = 0;

		throw exc;
	}

	return id;
}